

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O2

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,string *config,string *lang,
          cmCompiledGeneratorExpression *inputExpression,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outputFiles,mode_t perm)

{
  cmMakefile *pcVar1;
  bool bVar2;
  __type _Var3;
  char *pcVar4;
  ostream *poVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  string outputFileName;
  string outputContent;
  string local_2b8;
  string rawCondition;
  cmGeneratedFileStream fout;
  
  std::__cxx11::string::string((string *)&rawCondition,(string *)&((this->Condition).x_)->Input);
  if (rawCondition._M_string_length != 0) {
    pcVar4 = cmCompiledGeneratorExpression::Evaluate
                       ((this->Condition).x_,this->Makefile,config,false,(cmTarget *)0x0,
                        (cmTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,lang);
    std::__cxx11::string::string((string *)&outputFileName,pcVar4,(allocator *)&fout);
    bVar2 = std::operator==(&outputFileName,"0");
    if (bVar2) goto LAB_003b123d;
    bVar2 = std::operator!=(&outputFileName,"1");
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
      poVar5 = std::operator<<((ostream *)&fout,"Evaluation file condition \"");
      poVar5 = std::operator<<(poVar5,(string *)&rawCondition);
      poVar5 = std::operator<<(poVar5,"\" did not evaluate to valid content. Got \"");
      poVar5 = std::operator<<(poVar5,(string *)&outputFileName);
      std::operator<<(poVar5,"\".");
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&outputContent);
      std::__cxx11::string::~string((string *)&outputContent);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fout);
      goto LAB_003b123d;
    }
    std::__cxx11::string::~string((string *)&outputFileName);
  }
  pcVar4 = cmCompiledGeneratorExpression::Evaluate
                     ((this->OutputFileExpr).x_,this->Makefile,config,false,(cmTarget *)0x0,
                      (cmTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,lang);
  std::__cxx11::string::string((string *)&outputFileName,pcVar4,(allocator *)&fout);
  pcVar4 = cmCompiledGeneratorExpression::Evaluate
                     (inputExpression,this->Makefile,config,false,(cmTarget *)0x0,(cmTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,lang);
  std::__cxx11::string::string((string *)&outputContent,pcVar4,(allocator *)&fout);
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&outputFiles->_M_t,&outputFileName);
  if ((_Rb_tree_header *)iVar6._M_node == &(outputFiles->_M_t)._M_impl.super__Rb_tree_header) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string
              ((string *)&fout,outputFileName._M_dataplus._M_p,(allocator *)&local_2b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pcVar1->OutputFiles,(value_type *)&fout);
    std::__cxx11::string::~string((string *)&fout);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Files,&outputFileName);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](outputFiles,&outputFileName);
    std::__cxx11::string::_M_assign((string *)pmVar7);
    cmGeneratedFileStream::cmGeneratedFileStream(&fout,outputFileName._M_dataplus._M_p,false);
    cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
    std::operator<<((ostream *)&fout,(string *)&outputContent);
    bVar2 = cmGeneratedFileStream::Close(&fout);
    if (bVar2 && perm != 0) {
      cmsys::SystemTools::SetPermissions(outputFileName._M_dataplus._M_p,perm);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  }
  else {
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (iVar6._M_node + 2),&outputContent);
    if (!_Var3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
      poVar5 = std::operator<<((ostream *)&fout,
                               "Evaluation file to be written multiple times for different configurations or languages with different content:\n  "
                              );
      std::operator<<(poVar5,(string *)&outputFileName);
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fout);
    }
  }
  std::__cxx11::string::~string((string *)&outputContent);
LAB_003b123d:
  std::__cxx11::string::~string((string *)&outputFileName);
  std::__cxx11::string::~string((string *)&rawCondition);
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(const std::string& config,
              const std::string& lang,
              cmCompiledGeneratorExpression* inputExpression,
              std::map<std::string, std::string> &outputFiles, mode_t perm)
{
  std::string rawCondition = this->Condition->GetInput();
  if (!rawCondition.empty())
    {
    std::string condResult = this->Condition->Evaluate(this->Makefile, config,
                                                       false, 0, 0, 0, lang);
    if (condResult == "0")
      {
      return;
      }
    if (condResult != "1")
      {
      std::ostringstream e;
      e << "Evaluation file condition \"" << rawCondition << "\" did "
          "not evaluate to valid content. Got \"" << condResult << "\".";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
    }

  const std::string outputFileName
                    = this->OutputFileExpr->Evaluate(this->Makefile, config,
                                                     false, 0, 0, 0, lang);
  const std::string outputContent
                          = inputExpression->Evaluate(this->Makefile, config,
                                                      false, 0, 0, 0, lang);

  std::map<std::string, std::string>::iterator it
                                          = outputFiles.find(outputFileName);

  if(it != outputFiles.end())
    {
    if (it->second == outputContent)
      {
      return;
      }
    std::ostringstream e;
    e << "Evaluation file to be written multiple times for different "
         "configurations or languages with different content:\n  "
      << outputFileName;
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }

  this->Makefile->AddCMakeOutputFile(outputFileName.c_str());
  this->Files.push_back(outputFileName);
  outputFiles[outputFileName] = outputContent;

  cmGeneratedFileStream fout(outputFileName.c_str());
  fout.SetCopyIfDifferent(true);
  fout << outputContent;
  if (fout.Close() && perm)
    {
    cmSystemTools::SetPermissions(outputFileName.c_str(), perm);
    }
}